

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O1

void duckdb::PragmaTableInfoFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  CatalogType CVar1;
  char cVar2;
  FunctionData *pFVar3;
  GlobalTableFunctionState *pGVar4;
  TableCatalogEntry *this;
  ColumnConstraintInfo constraint_info;
  ColumnList *pCVar5;
  ColumnDefinition *column;
  reference other;
  reference name;
  NotImplementedException *this_00;
  _func_int **pp_Var6;
  __node_base *this_01;
  idx_t iVar7;
  idx_t i;
  LogicalIndex idx;
  _func_int **pp_Var8;
  string local_50;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pFVar3 = (data_p->bind_data).ptr;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar4 = (data_p->global_state).ptr;
  this = (TableCatalogEntry *)pFVar3[4]._vptr_FunctionData;
  CVar1 = (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type;
  if (CVar1 == VIEW_ENTRY) {
    pp_Var8 = pGVar4[1]._vptr_GlobalTableFunctionState;
    pp_Var6 = (_func_int **)
              (((long)((long)(this->columns).name_map._M_h._M_single_bucket -
                      (this->columns).name_map._M_h._M_rehash_policy._M_next_resize) >> 3) *
              -0x5555555555555555);
    if (pp_Var8 < pp_Var6) {
      cVar2 = *(char *)&pFVar3[5]._vptr_FunctionData;
      if (pp_Var8 + 0x100 < pp_Var6) {
        pp_Var6 = pp_Var8 + 0x100;
      }
      output->count = (long)pp_Var6 - (long)pp_Var8;
      if (pp_Var8 < (_func_int **)0xfffffffffffff800) {
        do {
          iVar7 = (long)pp_Var8 - (long)pGVar4[1]._vptr_GlobalTableFunctionState;
          other = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)
                             &(this->columns).name_map._M_h._M_rehash_policy._M_next_resize,
                             (size_type)pp_Var8);
          LogicalType::LogicalType((LogicalType *)&local_50,other);
          this_01 = (__node_base *)
                    ((long)&(this->columns).physical_columns.
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl + 8);
          if (pp_Var8 < (_func_int **)
                        ((long)((this->columns).name_map._M_h._M_element_count -
                               (long)(this->columns).name_map._M_h._M_before_begin._M_nxt) >> 5)) {
            this_01 = &(this->columns).name_map._M_h._M_before_begin;
          }
          name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)this_01,(size_type)pp_Var8);
          if (cVar2 == '\0') {
            PragmaShowHelper::GetViewColumns
                      ((idx_t)pp_Var8,name,(LogicalType *)&local_50,output,iVar7);
          }
          else {
            PragmaTableInfoHelper::GetViewColumns
                      ((idx_t)pp_Var8,name,(LogicalType *)&local_50,output,iVar7);
          }
          LogicalType::~LogicalType((LogicalType *)&local_50);
          pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
        } while (pp_Var8 < pp_Var6);
      }
      pGVar4[1]._vptr_GlobalTableFunctionState = pp_Var6;
    }
  }
  else {
    if (CVar1 != TABLE_ENTRY) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Unimplemented catalog type for pragma_table_info","");
      NotImplementedException::NotImplementedException(this_00,&local_50);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    cVar2 = *(char *)&pFVar3[5]._vptr_FunctionData;
    pp_Var8 = pGVar4[1]._vptr_GlobalTableFunctionState;
    pCVar5 = TableCatalogEntry::GetColumns(this);
    if (pp_Var8 < (_func_int **)
                  (((long)(pCVar5->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar5->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed)) {
      pp_Var8 = pGVar4[1]._vptr_GlobalTableFunctionState;
      pCVar5 = TableCatalogEntry::GetColumns(this);
      pp_Var6 = (_func_int **)
                (((long)(pCVar5->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar5->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      if (pp_Var8 + 0x100 < pp_Var6) {
        pp_Var6 = pp_Var8 + 0x100;
      }
      idx.index = (idx_t)pGVar4[1]._vptr_GlobalTableFunctionState;
      output->count = (long)pp_Var6 - idx.index;
      if (idx.index <= pp_Var6 && (long)pp_Var6 - idx.index != 0) {
        do {
          iVar7 = idx.index - (long)pGVar4[1]._vptr_GlobalTableFunctionState;
          column = TableCatalogEntry::GetColumn(this,idx);
          constraint_info = CheckConstraints(this,column);
          if (cVar2 == '\0') {
            PragmaShowHelper::GetTableColumns(column,constraint_info,output,iVar7);
          }
          else {
            PragmaTableInfoHelper::GetTableColumns(column,constraint_info,output,iVar7);
          }
          idx.index = idx.index + 1;
        } while (pp_Var6 != (_func_int **)idx.index);
      }
      pGVar4[1]._vptr_GlobalTableFunctionState = pp_Var6;
    }
  }
  return;
}

Assistant:

static void PragmaTableInfoFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<PragmaTableFunctionData>();
	auto &state = data_p.global_state->Cast<PragmaTableOperatorData>();
	switch (bind_data.entry.type) {
	case CatalogType::TABLE_ENTRY:
		PragmaTableInfoTable(state, bind_data.entry.Cast<TableCatalogEntry>(), output, bind_data.is_table_info);
		break;
	case CatalogType::VIEW_ENTRY:
		PragmaTableInfoView(state, bind_data.entry.Cast<ViewCatalogEntry>(), output, bind_data.is_table_info);
		break;
	default:
		throw NotImplementedException("Unimplemented catalog type for pragma_table_info");
	}
}